

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall
inja::InjaError::InjaError(InjaError *this,string *type,string *message,SourceLocation location)

{
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *message_local;
  string *type_local;
  InjaError *this_local;
  SourceLocation location_local;
  
  location_local.line = location.column;
  this_local = (InjaError *)location.line;
  local_30 = message;
  message_local = type;
  type_local = (string *)this;
  ::std::operator+(&local_110,"[inja.exception.",type);
  ::std::operator+(&local_f0,&local_110,"] (at ");
  std::__cxx11::to_string(&local_140,(unsigned_long)this_local);
  ::std::operator+(&local_d0,&local_f0,&local_140);
  ::std::operator+(&local_b0,&local_d0,":");
  std::__cxx11::to_string(&local_160,location_local.line);
  ::std::operator+(&local_90,&local_b0,&local_160);
  ::std::operator+(&local_70,&local_90,") ");
  ::std::operator+(&local_50,&local_70,local_30);
  ::std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_160);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_140);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&local_110);
  *(undefined ***)this = &PTR__InjaError_001c1ed0;
  ::std::__cxx11::string::string((string *)&this->type,(string *)message_local);
  ::std::__cxx11::string::string((string *)&this->message,(string *)local_30);
  (this->location).line = (size_t)this_local;
  (this->location).column = location_local.line;
  return;
}

Assistant:

explicit InjaError(const std::string& type, const std::string& message, SourceLocation location)
      : std::runtime_error("[inja.exception." + type + "] (at " + std::to_string(location.line) + ":" + std::to_string(location.column) + ") " + message),
        type(type), message(message), location(location) {}